

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase * AnalyzeType(ExpressionContext *ctx,SynBase *syntax,bool onlyType,bool *failed)

{
  __jmp_buf_tag *__env;
  ScopeData *pSVar1;
  long lVar2;
  IntrusiveList<TypeHandle> generics;
  bool bVar3;
  int iVar4;
  TypeBase *pTVar5;
  TypeGenericAlias *pTVar6;
  TypeBase *type;
  undefined4 extraout_var;
  TypeRef *pTVar7;
  ExprBase *pEVar8;
  TypeHandle *pTVar9;
  TypeUnsizedArray *pTVar10;
  TypeFunction *pTVar11;
  ScopeData *pSVar12;
  TypeGenericClassProto *proto;
  undefined4 extraout_var_00;
  TypeGenericClass *pTVar13;
  TypeArray *pTVar14;
  SynBase *pSVar15;
  _func_int **pp_Var16;
  uint uVar17;
  SynIdentifier *pSVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  SynIdentifier *pSVar22;
  byte bVar23;
  _func_int **pp_Var24;
  SynBase *pSVar25;
  uint uVar26;
  ulong uVar27;
  uint count_1;
  SynTypeAlias *node;
  _func_int **pp_Var28;
  IntrusiveList<TypeHandle> arguments;
  jmp_buf prevErrorHandler;
  IntrusiveList<TypeHandle> local_f8 [12];
  
  if (syntax == (SynBase *)0x0) goto LAB_001e53b9;
  uVar17 = syntax->typeID;
  switch(uVar17) {
  case 5:
    return ctx->typeAuto;
  case 6:
    goto switchD_001e4c37_caseD_6;
  case 7:
  case 0xc:
    goto switchD_001e4c37_caseD_7;
  case 8:
    pTVar6 = ExpressionContext::GetGenericAliasType(ctx,(SynIdentifier *)syntax[1]._vptr_SynBase);
    return &pTVar6->super_TypeBase;
  case 9:
    pTVar5 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
    if (pTVar5 == (TypeBase *)0x0 && !onlyType) {
      return (TypeBase *)0x0;
    }
    if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0)) {
      pTVar5 = ApplyArraySizesToType(ctx,pTVar5,*(SynBase **)&syntax[1].typeID);
      return pTVar5;
    }
    break;
  case 10:
    pTVar5 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,true,failed);
    if (pTVar5 != (TypeBase *)0x0) {
      if (pTVar5->typeID == 0) break;
      if (pTVar5->typeID == 0xe) {
        return &ctx->typeAutoRef->super_TypeBase;
      }
    }
    bVar3 = AssertResolvableType(ctx,syntax,pTVar5,true);
    if (bVar3) {
      pTVar7 = ExpressionContext::GetReferenceType(ctx,pTVar5);
      return &pTVar7->super_TypeBase;
    }
    break;
  case 0xb:
    pTVar5 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
    if (pTVar5 == (TypeBase *)0x0 && !onlyType) {
      return (TypeBase *)0x0;
    }
    if (((pTVar5 != (TypeBase *)0x0) && (pTVar5->typeID == 0)) ||
       (bVar3 = AssertResolvableType(ctx,syntax,pTVar5,true), !bVar3)) break;
    if (pTVar5 == ctx->typeAuto) {
      pcVar20 = "ERROR: return type of a function type cannot be auto";
    }
    else {
      local_f8[0].head = (TypeHandle *)0x0;
      local_f8[0].tail = (TypeHandle *)0x0;
      pSVar15 = *(SynBase **)&syntax[1].typeID;
      while( true ) {
        if (pSVar15 == (SynBase *)0x0) {
          arguments.tail = local_f8[0].tail;
          arguments.head = local_f8[0].head;
          pTVar11 = ExpressionContext::GetFunctionType(ctx,syntax,pTVar5,arguments);
          return &pTVar11->super_TypeBase;
        }
        type = AnalyzeType(ctx,pSVar15,onlyType,failed);
        if (type == (TypeBase *)0x0 && !onlyType) {
          return (TypeBase *)0x0;
        }
        if (((type != (TypeBase *)0x0) && (type->typeID == 0)) ||
           (bVar3 = AssertResolvableType(ctx,syntax,type,true), !bVar3)) goto LAB_001e54cb;
        if (type == ctx->typeAuto) break;
        if (type == ctx->typeVoid) {
          pcVar20 = "ERROR: function argument cannot be a void type";
          goto LAB_001e568a;
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar9 = (TypeHandle *)CONCAT44(extraout_var,iVar4);
        pTVar9->type = type;
        pTVar9->next = (TypeHandle *)0x0;
        pTVar9->listed = false;
        IntrusiveList<TypeHandle>::push_back(local_f8,pTVar9);
        pSVar15 = pSVar15->next;
      }
      pcVar20 = "ERROR: function argument cannot be an auto type";
    }
    goto LAB_001e568a;
  case 0xd:
    __env = ctx->errorHandler;
    memcpy(local_f8,__env,200);
    bVar3 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    pcVar20 = ctx->errorBuf;
    uVar17 = ctx->errorBufSize;
    if (failed != (bool *)0x0) {
      ctx->errorBuf = (char *)0x0;
      ctx->errorBufSize = 0;
    }
    pSVar1 = ctx->scope;
    uVar26 = *(uint *)(NULLC::traceContext + 0x244);
    iVar4 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar4 != 0) {
      NULLC::TraceLeaveTo(uVar26);
      if (ctx->scope != pSVar1) {
        ctx->scope = pSVar1;
        ctx->lookupLocation = (SynBase *)0x0;
      }
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar3;
      ctx->errorBuf = pcVar20;
      ctx->errorBufSize = uVar17;
      if (failed == (bool *)0x0) {
        longjmp((__jmp_buf_tag *)__env,1);
      }
      *failed = true;
      goto switchD_001e4c37_caseD_6;
    }
    pTVar5 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,false,(bool *)0x0);
    if (pTVar5 == (TypeBase *)0x0) {
      pEVar8 = AnalyzeExpression(ctx,(SynBase *)syntax[1]._vptr_SynBase);
      if (pEVar8->type == ctx->typeAuto) {
        pcVar20 = "ERROR: cannot take typeid from auto type";
        goto LAB_001e568a;
      }
      AssertValueExpression(ctx,syntax,pEVar8);
      pTVar5 = pEVar8->type;
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar3;
      ctx->errorBuf = pcVar20;
      ctx->errorBufSize = uVar17;
      if (pTVar5 == (TypeBase *)0x0) {
        uVar17 = syntax->typeID;
        goto switchD_001e4c37_caseD_7;
      }
    }
    else {
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar3;
      ctx->errorBuf = pcVar20;
      ctx->errorBufSize = uVar17;
    }
    syntax = (SynBase *)syntax[1]._vptr_SynBase;
    if (pTVar5->typeID == 0x1b) {
      pcVar20 = "ERROR: expected \'.first\'/\'.last\'/\'[N]\'/\'.size\' after \'argument\'";
    }
    else if (pTVar5->typeID == 0x1c) {
      pcVar20 = "ERROR: expected \'(\' after \'hasMember\'";
    }
    else {
      if (pTVar5->isGeneric != true) {
        return pTVar5;
      }
      pcVar20 = "ERROR: cannot take typeid from generic type";
    }
LAB_001e51b1:
    anon_unknown.dwarf_1117a3::Report(ctx,syntax,pcVar20);
    break;
  default:
    if (uVar17 == 0x19) {
      pTVar5 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
      if (pTVar5 == (TypeBase *)0x0 && !onlyType) {
        return (TypeBase *)0x0;
      }
      if (pTVar5 != (TypeBase *)0x0) {
        uVar17 = pTVar5->typeID;
        if (uVar17 == 0) break;
        if (uVar17 == 0xe) {
          if (*(long *)&syntax[1].typeID == 0) {
            return &ctx->typeAutoArray->super_TypeBase;
          }
          pcVar20 = "ERROR: cannot specify array size for auto";
          goto LAB_001e568a;
        }
        if (uVar17 == 1) {
          pcVar20 = "ERROR: cannot define an array of \'void\'";
          goto LAB_001e51b1;
        }
      }
      lVar2 = *(long *)&syntax[1].typeID;
      if (lVar2 == 0) {
        if (pTVar5->size < 0x10000) {
          bVar3 = AssertResolvableType(ctx,syntax,pTVar5,true);
          if (bVar3) {
            pTVar10 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar5);
            return (TypeBase *)pTVar10;
          }
          break;
        }
      }
      else {
        uVar17 = 0;
        lVar21 = lVar2;
        do {
          uVar17 = uVar17 + 1;
          lVar21 = *(long *)(lVar21 + 0x30);
        } while (lVar21 != 0);
        if (1 < uVar17) {
          pcVar20 = "ERROR: \',\' is not expected in array type size";
          goto LAB_001e568a;
        }
        if (*(long *)(lVar2 + 0x40) != 0) {
          pcVar20 = "ERROR: named argument not expected in array type size";
          goto LAB_001e568a;
        }
        pEVar8 = AnalyzeExpression(ctx,*(SynBase **)(lVar2 + 0x48));
        if ((pEVar8->type != (TypeBase *)0x0) && (pEVar8->type->typeID == 0)) break;
        pEVar8 = CreateCast(ctx,syntax,pEVar8,ctx->typeLong,false);
        pEVar8 = anon_unknown.dwarf_1117a3::EvaluateExpression(ctx,syntax,pEVar8);
        if ((pEVar8 == (ExprBase *)0x0) || (pEVar8->typeID != 6)) {
          if (!onlyType) {
            return (TypeBase *)0x0;
          }
          pcVar20 = "ERROR: index must be a constant expression";
          goto LAB_001e568a;
        }
        if (pTVar5 == (TypeBase *)0x0) {
          if ((long)pEVar8[1]._vptr_ExprBase < 1) {
LAB_001e5796:
            pcVar20 = "ERROR: array size can\'t be negative or zero";
            goto LAB_001e568a;
          }
        }
        else {
          pp_Var28 = pEVar8[1]._vptr_ExprBase;
          if (pTVar5->typeID == 0x1b) {
            if ((long)pp_Var28 < 0) {
              pcVar20 = "ERROR: argument index can\'t be negative";
            }
            else {
              pp_Var16 = pTVar5[1]._vptr_TypeBase;
              if (pp_Var16 != (_func_int **)0x0) {
                uVar17 = 0;
                pp_Var24 = pp_Var16;
                do {
                  uVar17 = uVar17 + 1;
                  pp_Var24 = (_func_int **)pp_Var24[1];
                } while (pp_Var24 != (_func_int **)0x0);
                if ((long)(ulong)uVar17 <= (long)pp_Var28) {
                  pcVar20 = (pTVar5->name).begin;
                  uVar17 = 0;
                  do {
                    uVar17 = uVar17 + 1;
                    pp_Var16 = (_func_int **)pp_Var16[1];
                  } while (pp_Var16 != (_func_int **)0x0);
                  anon_unknown.dwarf_1117a3::Stop
                            (ctx,syntax,"ERROR: this function type \'%.*s\' has only %d argument(s)"
                             ,(ulong)(uint)((int)(pTVar5->name).end - (int)pcVar20),pcVar20,
                             (ulong)uVar17);
                }
                pTVar9 = IntrusiveList<TypeHandle>::operator[]
                                   ((IntrusiveList<TypeHandle> *)(pTVar5 + 1),(uint)pp_Var28);
                return pTVar9->type;
              }
              pcVar20 = "ERROR: function argument set is empty";
            }
            goto LAB_001e568a;
          }
          if ((long)pp_Var28 < 1) goto LAB_001e5796;
          if ((pTVar5->typeID == 0x18) && (*(char *)((long)&pTVar5[3]._vptr_TypeBase + 2) == '\x01')
             ) {
            uVar17 = *(int *)&(pTVar5->name).end - (int)(pTVar5->name).begin;
            pcVar20 = 
            "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
            ;
            goto LAB_001e5406;
          }
        }
        if (pTVar5->size < 0x10000) {
          bVar3 = AssertResolvableType(ctx,syntax,pTVar5,true);
          if (bVar3) {
            pTVar14 = ExpressionContext::GetArrayType(ctx,pTVar5,(longlong)pEVar8[1]._vptr_ExprBase)
            ;
            return &pTVar14->super_TypeBase;
          }
          break;
        }
      }
      pcVar20 = "ERROR: array element size cannot exceed 65535 bytes";
      goto LAB_001e568a;
    }
switchD_001e4c37_caseD_7:
    if ((int)uVar17 < 0xc) {
      if (uVar17 == 0) break;
      if (uVar17 == 7) {
        pSVar1 = ctx->scope;
        while (pSVar12 = pSVar1, pSVar12 != (ScopeData *)0x0) {
          if ((pSVar12->ownerNamespace != (NamespaceData *)0x0) ||
             (pSVar1 = pSVar12->scope, pSVar12->scope == (ScopeData *)0x0)) {
            do {
              if (pSVar12->ownerNamespace == (NamespaceData *)0x0) {
                uVar17 = NULLC::GetStringHash("");
              }
              else {
                uVar17 = NULLC::StringHashContinue(pSVar12->ownerNamespace->fullNameHash,".");
              }
              pp_Var28 = syntax[1]._vptr_SynBase;
              if (pp_Var28 != (_func_int **)0x0) {
                do {
                  uVar17 = NULLC::StringHashContinue(uVar17,(char *)pp_Var28[8],(char *)pp_Var28[9])
                  ;
                  uVar17 = NULLC::StringHashContinue(uVar17,".");
                  pp_Var28 = (_func_int **)pp_Var28[6];
                  if (pp_Var28 == (_func_int **)0x0) break;
                } while (*(int *)(pp_Var28 + 1) == 4);
              }
              uVar17 = NULLC::StringHashContinue
                                 (uVar17,(char *)syntax[1].begin,(char *)syntax[1].end);
              pTVar5 = anon_unknown.dwarf_1117a3::LookupTypeByName
                                 ((anon_unknown_dwarf_1117a3 *)ctx->scope,
                                  (ExpressionContext *)ctx->lookupLocation,uVar17);
              bVar3 = pTVar5 == (TypeBase *)0x0;
              if (!bVar3) {
                return pTVar5;
              }
              pSVar1 = pSVar12->scope;
              do {
                pSVar12 = pSVar1;
                if (pSVar12 == (ScopeData *)0x0) goto LAB_001e54a0;
              } while ((pSVar12->ownerNamespace == (NamespaceData *)0x0) &&
                      (pSVar1 = pSVar12->scope, pSVar12->scope != (ScopeData *)0x0));
            } while( true );
          }
        }
        bVar3 = true;
LAB_001e54a0:
        if ((bVar3 & onlyType) != 1) {
          return (TypeBase *)0x0;
        }
        anon_unknown.dwarf_1117a3::Report
                  (ctx,syntax,"ERROR: \'%.*s\' is not a known type name",
                   (ulong)(uint)(*(int *)&syntax[1].end - (int)syntax[1].begin));
        break;
      }
    }
    else {
      if (uVar17 == 0xc) {
        proto = (TypeGenericClassProto *)
                AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,true,failed);
        if (proto != (TypeGenericClassProto *)0x0) {
          uVar17 = (proto->super_TypeBase).typeID;
          if (uVar17 == 0x16) {
            pSVar22 = (proto->definition->aliases).head;
            pSVar15 = *(SynBase **)&syntax[1].typeID;
            uVar17 = 0;
            if (pSVar15 != (SynBase *)0x0) {
              uVar17 = 0;
              pSVar25 = pSVar15;
              do {
                uVar17 = uVar17 + 1;
                pSVar25 = pSVar25->next;
              } while (pSVar25 != (SynBase *)0x0);
            }
            uVar26 = 0;
            if (pSVar22 != (SynIdentifier *)0x0) {
              uVar26 = 0;
              pSVar18 = pSVar22;
              do {
                uVar26 = uVar26 + 1;
                pSVar18 = (SynIdentifier *)(pSVar18->super_SynBase).next;
              } while (pSVar18 != (SynIdentifier *)0x0);
            }
            if (uVar17 < uVar26) {
              uVar19 = 0;
              if (pSVar15 != (SynBase *)0x0) {
                uVar17 = 0;
                do {
                  uVar17 = uVar17 + 1;
                  pSVar15 = pSVar15->next;
                  uVar19 = (ulong)uVar17;
                } while (pSVar15 != (SynBase *)0x0);
              }
              uVar27 = 0;
              if (pSVar22 != (SynIdentifier *)0x0) {
                uVar17 = 0;
                do {
                  uVar17 = uVar17 + 1;
                  pSVar22 = (SynIdentifier *)(pSVar22->super_SynBase).next;
                  uVar27 = (ulong)uVar17;
                } while (pSVar22 != (SynIdentifier *)0x0);
              }
              pcVar20 = 
              "ERROR: there where only \'%d\' argument(s) to a generic type that expects \'%d\'";
              goto LAB_001e5789;
            }
            if (pSVar15 == (SynBase *)0x0) {
              uVar17 = 0;
              if (pSVar22 == (SynIdentifier *)0x0) {
                local_f8[0].head = (TypeHandle *)0x0;
                local_f8[0].tail = (TypeHandle *)0x0;
                goto LAB_001e55e5;
              }
LAB_001e5505:
              uVar26 = 0;
              pSVar18 = pSVar22;
              do {
                uVar26 = uVar26 + 1;
                pSVar18 = (SynIdentifier *)(pSVar18->super_SynBase).next;
              } while (pSVar18 != (SynIdentifier *)0x0);
              if (uVar26 < uVar17) {
                if (pSVar22 == (SynIdentifier *)0x0) {
LAB_001e573f:
                  uVar19 = 0;
                }
                else {
                  uVar17 = 0;
                  do {
                    uVar17 = uVar17 + 1;
                    pSVar22 = (SynIdentifier *)(pSVar22->super_SynBase).next;
                    uVar19 = (ulong)uVar17;
                  } while (pSVar22 != (SynIdentifier *)0x0);
                }
                uVar27 = 0;
                if (pSVar15 != (SynBase *)0x0) {
                  uVar17 = 0;
                  do {
                    uVar17 = uVar17 + 1;
                    pSVar15 = pSVar15->next;
                    uVar27 = (ulong)uVar17;
                  } while (pSVar15 != (SynBase *)0x0);
                }
                pcVar20 = "ERROR: type has only \'%d\' generic argument(s) while \'%d\' specified";
LAB_001e5789:
                anon_unknown.dwarf_1117a3::Stop(ctx,syntax,pcVar20,uVar19,uVar27);
              }
            }
            else {
              uVar17 = 0;
              pSVar25 = pSVar15;
              do {
                uVar17 = uVar17 + 1;
                pSVar25 = pSVar25->next;
              } while (pSVar25 != (SynBase *)0x0);
              if (pSVar22 != (SynIdentifier *)0x0) goto LAB_001e5505;
              if (uVar17 != 0) goto LAB_001e573f;
            }
            local_f8[0].head = (TypeHandle *)0x0;
            local_f8[0].tail = (TypeHandle *)0x0;
            if (pSVar15 != (SynBase *)0x0) {
              bVar23 = 0;
              do {
                pTVar5 = AnalyzeType(ctx,pSVar15,true,failed);
                if (pTVar5 == ctx->typeAuto) {
                  pcVar20 = "ERROR: \'auto\' type cannot be used as template argument";
                  goto LAB_001e568a;
                }
                if ((pTVar5 != (TypeBase *)0x0) && (pTVar5->typeID == 0)) goto LAB_001e54cb;
                bVar23 = bVar23 | pTVar5->isGeneric;
                iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                pTVar9 = (TypeHandle *)CONCAT44(extraout_var_00,iVar4);
                pTVar9->type = pTVar5;
                pTVar9->next = (TypeHandle *)0x0;
                pTVar9->listed = false;
                IntrusiveList<TypeHandle>::push_back(local_f8,pTVar9);
                pSVar15 = pSVar15->next;
              } while (pSVar15 != (SynBase *)0x0);
              if ((bVar23 & 1) != 0) {
                generics.tail = local_f8[0].tail;
                generics.head = local_f8[0].head;
                pTVar13 = ExpressionContext::GetGenericClassType(ctx,syntax,proto,generics);
                return &pTVar13->super_TypeBase;
              }
            }
LAB_001e55e5:
            pTVar5 = CreateGenericTypeInstance(ctx,syntax,proto,local_f8);
            return pTVar5;
          }
          if (uVar17 == 0) break;
        }
        uVar17 = *(int *)&(proto->super_TypeBase).name.end - (int)(proto->super_TypeBase).name.begin
        ;
        pcVar20 = "ERROR: type \'%.*s\' can\'t have generic arguments";
LAB_001e5406:
        anon_unknown.dwarf_1117a3::Stop(ctx,syntax,pcVar20,(ulong)uVar17);
      }
      if (uVar17 == 0x17) {
        pTVar5 = AnalyzeType(ctx,(SynBase *)syntax[1]._vptr_SynBase,onlyType,failed);
        if (pTVar5 == (TypeBase *)0x0 && !onlyType) {
          return (TypeBase *)0x0;
        }
        if (pTVar5 != (TypeBase *)0x0) {
          if (pTVar5->typeID == 0) break;
          if (pTVar5->typeID == 0xc) {
switchD_001e4c37_caseD_6:
            return ctx->typeGeneric;
          }
        }
        pEVar8 = CreateTypeidMemberAccess(ctx,syntax,pTVar5,*(SynIdentifier **)&syntax[1].typeID);
        if ((pEVar8 != (ExprBase *)0x0) && (pEVar8->typeID == 8)) {
          return (TypeBase *)pEVar8[1]._vptr_ExprBase;
        }
        if (!onlyType) {
          return (TypeBase *)0x0;
        }
        pcVar20 = "ERROR: typeof expression result is not a type";
        goto LAB_001e568a;
      }
    }
LAB_001e53b9:
    if (!onlyType) {
      return (TypeBase *)0x0;
    }
    pcVar20 = "ERROR: unknown type";
LAB_001e568a:
    anon_unknown.dwarf_1117a3::Stop(ctx,syntax,pcVar20);
  }
LAB_001e54cb:
  pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  return pTVar5;
}

Assistant:

TypeBase* AnalyzeType(ExpressionContext &ctx, SynBase *syntax, bool onlyType = true, bool *failed = NULL)
{
	if(isType<SynTypeAuto>(syntax))
	{
		return ctx.typeAuto;
	}

	if(isType<SynTypeGeneric>(syntax))
	{
		return ctx.typeGeneric;
	}

	if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		return ctx.GetGenericAliasType(node->name);
	}

	if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, true, failed);

		if(isType<TypeAuto>(type))
			return ctx.typeAutoRef;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, type, true))
			return ctx.GetErrorType();

		return ctx.GetReferenceType(type);
	}

	if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		return ApplyArraySizesToType(ctx, type, node->sizes.head);
	}

	if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeVoid>(type))
		{
			Report(ctx, syntax, "ERROR: cannot define an array of 'void'");

			return ctx.GetErrorType();
		}

		if(isType<TypeAuto>(type))
		{
			if(!node->arguments.empty())
				Stop(ctx, syntax, "ERROR: cannot specify array size for auto");

			return ctx.typeAutoArray;
		}

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(node->arguments.empty())
		{
			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetUnsizedArrayType(type);
		}

		if(node->arguments.size() > 1)
			Stop(ctx, syntax, "ERROR: ',' is not expected in array type size");

		SynCallArgument *argument = node->arguments.head;

		if(argument->name)
			Stop(ctx, syntax, "ERROR: named argument not expected in array type size");

		ExprBase *size = AnalyzeExpression(ctx, argument->value);

		if(isType<TypeError>(size->type))
			return ctx.GetErrorType();

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, node, size, ctx.typeLong, false))))
		{
			if(TypeArgumentSet *lhs = getType<TypeArgumentSet>(type))
			{
				if(number->value < 0)
					Stop(ctx, syntax, "ERROR: argument index can't be negative");

				if(lhs->types.empty())
					Stop(ctx, syntax, "ERROR: function argument set is empty");

				if(number->value >= lhs->types.size())
					Stop(ctx, syntax, "ERROR: this function type '%.*s' has only %d argument(s)", FMT_ISTR(type->name), lhs->types.size());

				return lhs->types[unsigned(number->value)]->type;
			}

			if(number->value <= 0)
				Stop(ctx, syntax, "ERROR: array size can't be negative or zero");

			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->hasFinalizer)
					Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
			}

			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetArrayType(type, number->value);
		}

		if(!onlyType)
			return NULL;

		Stop(ctx, syntax, "ERROR: index must be a constant expression");
	}

	if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		TypeBase *returnType = AnalyzeType(ctx, node->returnType, onlyType, failed);

		if(!onlyType && !returnType)
			return NULL;

		if(isType<TypeError>(returnType))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, returnType, true))
			return ctx.GetErrorType();

		if(returnType == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: return type of a function type cannot be auto");

		IntrusiveList<TypeHandle> arguments;

		for(SynBase *el = node->arguments.head; el; el = el->next)
		{
			TypeBase *argType = AnalyzeType(ctx, el, onlyType, failed);

			if(!onlyType && !argType)
				return NULL;

			if(isType<TypeError>(argType))
				return ctx.GetErrorType();

			if(!AssertResolvableType(ctx, syntax, argType, true))
				return ctx.GetErrorType();

			if(argType == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(argType == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
		}

		return ctx.GetFunctionType(syntax, returnType, arguments);
	}

	if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		jmp_buf prevErrorHandler;
		memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

		bool prevErrorHandlerNested = ctx.errorHandlerNested;
		ctx.errorHandlerNested = true;

		char *errorBuf = ctx.errorBuf;
		unsigned errorBufSize = ctx.errorBufSize;

		if(failed)
		{
			ctx.errorBuf = 0;
			ctx.errorBufSize = 0;
		}

		// Remember current scope
		ScopeData *scope = ctx.scope;

		unsigned traceDepth = NULLC::TraceGetDepth();

		if(!setjmp(ctx.errorHandler))
		{
			TypeBase *type = AnalyzeType(ctx, node->value, false);

			if(!type)
			{
				ExprBase *value = AnalyzeExpression(ctx, node->value);

				if(value->type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

				AssertValueExpression(ctx, syntax, value);

				type = value->type;
			}

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(type)
			{
				if(!AssertResolvableType(ctx, node->value, type, false))
					return ctx.GetErrorType();

				return type;
			}
		}
		else
		{
			NULLC::TraceLeaveTo(traceDepth);

			// Restore original scope
			if(ctx.scope != scope)
				ctx.SwitchToScopeAtPoint(scope, NULL);

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(failed)
			{
				*failed = true;
				return ctx.typeGeneric;
			}

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
		{
			unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

			for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			{
				hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
				hash = NULLC::StringHashContinue(hash, ".");
			}

			hash = NULLC::StringHashContinue(hash, node->name.begin, node->name.end);

			TypeBase *type = LookupTypeByName(ctx, hash);

			if(type)
				return type;
		}

		// Might be a variable
		if(!onlyType)
			return NULL;

		Report(ctx, syntax, "ERROR: '%.*s' is not a known type name", FMT_ISTR(node->name));

		return ctx.GetErrorType();
	}

	if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		TypeBase *value = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !value)
			return NULL;

		if(isType<TypeGeneric>(value))
			return ctx.typeGeneric;

		if(isType<TypeError>(value))
			return ctx.GetErrorType();

		ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, value, node->member);

		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(result))
			return typeLiteral->value;

		// [n]

		if(!onlyType)
			return NULL;

		// isReference/isArray/isFunction/arraySize/hasMember(x)/class member/class typedef

		Stop(ctx, syntax, "ERROR: typeof expression result is not a type");

		return NULL;
	}

	if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		TypeBase *baseType = AnalyzeType(ctx, node->baseType, true, failed);

		if(isType<TypeError>(baseType))
			return ctx.GetErrorType();

		// TODO: overloads with a different number of generic arguments

		if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(baseType))
		{
			IntrusiveList<SynIdentifier> aliases = proto->definition->aliases;

			if(node->types.size() < aliases.size())
				Stop(ctx, syntax, "ERROR: there where only '%d' argument(s) to a generic type that expects '%d'", node->types.size(), aliases.size());

			if(node->types.size() > aliases.size())
				Stop(ctx, syntax, "ERROR: type has only '%d' generic argument(s) while '%d' specified", aliases.size(), node->types.size());

			bool isGeneric = false;
			IntrusiveList<TypeHandle> types;

			for(SynBase *el = node->types.head; el; el = el->next)
			{
				TypeBase *type = AnalyzeType(ctx, el, true, failed);

				if(type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: 'auto' type cannot be used as template argument");

				if(isType<TypeError>(type))
					return ctx.GetErrorType();

				isGeneric |= type->isGeneric;

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			if(isGeneric)
				return ctx.GetGenericClassType(syntax, proto, types);
			
			return CreateGenericTypeInstance(ctx, syntax, proto, types);
		}

		Stop(ctx, syntax, "ERROR: type '%.*s' can't have generic arguments", FMT_ISTR(baseType->name));
	}

	if(isType<SynError>(syntax))
		return ctx.GetErrorType();

	if(!onlyType)
		return NULL;

	Stop(ctx, syntax, "ERROR: unknown type");

	return NULL;
}